

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

bool doctest::detail::isDebuggerActive(void)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  istream *piVar4;
  bool bVar5;
  string line;
  ifstream in;
  
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  std::ifstream::ifstream(&in,"/proc/self/status",_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  do {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&in,(string *)&line);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) goto LAB_00108b28;
    iVar2 = std::__cxx11::string::compare((ulong)&line,0,(char *)0xb);
  } while (iVar2 != 0);
  if (line._M_string_length < 0xc) {
LAB_00108b28:
    bVar5 = false;
  }
  else {
    bVar5 = line._M_dataplus._M_p[0xb] != '0';
  }
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&in);
  *piVar3 = iVar1;
  return bVar5;
}

Assistant:

~ErrnoGuard() { errno = m_oldErrno; }